

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

void __thiscall
cmCPackIFWPackage::DependenceStruct::DependenceStruct(DependenceStruct *this,string *dependence)

{
  char cVar1;
  string_view str;
  bool bVar2;
  long lVar3;
  string_view str_00;
  allocator<char> local_69;
  string_view versionPart;
  string local_58 [32];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Compare).Type = 0;
  (this->Compare).Value._M_dataplus._M_p = (pointer)&(this->Compare).Value.field_2;
  (this->Compare).Value._M_string_length = 0;
  (this->Compare).Value.field_2._M_local_buf[0] = '\0';
  lVar3 = std::__cxx11::string::find((char)dependence,0x3a);
  if ((lVar3 == -1) && (lVar3 = std::__cxx11::string::find((char)dependence,0x2d), lVar3 == -1)) {
    std::__cxx11::string::_M_assign((string *)this);
    return;
  }
  std::__cxx11::string::substr((ulong)local_58,(ulong)dependence);
  std::__cxx11::string::operator=((string *)this,local_58);
  std::__cxx11::string::~string(local_58);
  str_00._M_len = dependence->_M_string_length - (lVar3 + 1);
  if (str_00._M_len == 0) {
    return;
  }
  versionPart._M_str = (dependence->_M_dataplus)._M_p + lVar3 + 1;
  str_00._M_str = versionPart._M_str;
  versionPart._M_len = str_00._M_len;
  bVar2 = cmHasLiteralPrefix<3ul>(str_00,(char (*) [3])"<=");
  if (bVar2) {
    (this->Compare).Type = 3;
    local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&versionPart,2,0xffffffffffffffff);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_58,&local_38,&local_69);
  }
  else {
    str._M_str = versionPart._M_str;
    str._M_len = versionPart._M_len;
    bVar2 = cmHasLiteralPrefix<3ul>(str,(char (*) [3])0x5e9a19);
    if (bVar2) {
      (this->Compare).Type = 5;
      local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&versionPart,2,0xffffffffffffffff);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_58,&local_38,&local_69);
    }
    else {
      if (versionPart._M_len != 0) {
        cVar1 = *versionPart._M_str;
        if (cVar1 == '>') {
          (this->Compare).Type = 4;
          local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&versionPart,1,0xffffffffffffffff);
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_58,&local_38,&local_69);
          goto LAB_001725be;
        }
        if (cVar1 == '=') {
          (this->Compare).Type = 1;
          local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&versionPart,1,0xffffffffffffffff);
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_58,&local_38,&local_69);
          goto LAB_001725be;
        }
        if (cVar1 == '<') {
          (this->Compare).Type = 2;
          local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&versionPart,1,0xffffffffffffffff);
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_58,&local_38,&local_69);
          goto LAB_001725be;
        }
      }
      (this->Compare).Type = 1;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_58,&versionPart,(allocator<char> *)&local_38);
    }
  }
LAB_001725be:
  std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_58);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

cmCPackIFWPackage::DependenceStruct::DependenceStruct(
  const std::string& dependence)
{
  // Preferred format is name and version are separated by a colon (:), but
  // note that this is only supported with QtIFW 3.1 or later. Backward
  // compatibility allows a hyphen (-) as a separator instead, but names then
  // cannot contain a hyphen.
  size_t pos;
  if ((pos = dependence.find(':')) == std::string::npos) {
    pos = dependence.find('-');
  }

  if (pos != std::string::npos) {
    this->Name = dependence.substr(0, pos);
    ++pos;
    if (pos == dependence.size()) {
      // Nothing after the separator. Treat this as no version constraint.
      return;
    }

    const auto versionPart =
      cm::string_view(dependence.data() + pos, dependence.size() - pos);

    if (cmHasLiteralPrefix(versionPart, "<=")) {
      this->Compare.Type = cmCPackIFWPackage::CompareLessOrEqual;
      this->Compare.Value = std::string(versionPart.substr(2));
    } else if (cmHasLiteralPrefix(versionPart, ">=")) {
      this->Compare.Type = cmCPackIFWPackage::CompareGreaterOrEqual;
      this->Compare.Value = std::string(versionPart.substr(2));
    } else if (cmHasPrefix(versionPart, '<')) {
      this->Compare.Type = cmCPackIFWPackage::CompareLess;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else if (cmHasPrefix(versionPart, '=')) {
      this->Compare.Type = cmCPackIFWPackage::CompareEqual;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else if (cmHasPrefix(versionPart, '>')) {
      this->Compare.Type = cmCPackIFWPackage::CompareGreater;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else {
      // We found no operator but a version specification is still expected to
      // follow. The default behavior is to treat this the same as =. We
      // explicitly record that as our type (it simplifies our logic a little
      // and is also clearer).
      this->Compare.Type = cmCPackIFWPackage::CompareEqual;
      this->Compare.Value = std::string(versionPart);
    }
  } else {
    this->Name = dependence;
  }
}